

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2OrderParameter.cpp
# Opt level: O2

void __thiscall
OpenMD::P2OrderParameter::P2OrderParameter
          (P2OrderParameter *this,SimInfo *info,string *filename,string *sele1,int seleOffset)

{
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,1);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__P2OrderParameter_002ee090;
  this->doVect_ = false;
  this->doOffset_ = true;
  std::__cxx11::string::string((string *)&this->selectionScript1_,(string *)sele1);
  (this->selectionScript2_)._M_dataplus._M_p = (pointer)&(this->selectionScript2_).field_2;
  (this->selectionScript2_)._M_string_length = 0;
  (this->selectionScript2_).field_2._M_local_buf[0] = '\0';
  SelectionManager::SelectionManager(&this->seleMan1_,info);
  SelectionManager::SelectionManager(&this->seleMan2_,info);
  SelectionEvaluator::SelectionEvaluator(&this->evaluator1_,info);
  SelectionEvaluator::SelectionEvaluator(&this->evaluator2_,info);
  this->seleOffset_ = seleOffset;
  (this->orderParams_).
  super__Vector_base<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->orderParams_).
  super__Vector_base<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->orderParams_).
  super__Vector_base<OpenMD::P2OrderParameter::OrderParam,_std::allocator<OpenMD::P2OrderParameter::OrderParam>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getPrefix(&local_70,filename);
  std::operator+(&local_50,&local_70,".p2");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  SelectionEvaluator::loadScriptString(&this->evaluator1_,sele1);
  return;
}

Assistant:

P2OrderParameter::P2OrderParameter(SimInfo* info, const string& filename,
                                     const string& sele1, int seleOffset) :
      StaticAnalyser(info, filename, 1),
      doVect_(false), doOffset_(true), selectionScript1_(sele1),
      seleMan1_(info), seleMan2_(info), evaluator1_(info), evaluator2_(info),
      seleOffset_(seleOffset) {
    setOutputName(getPrefix(filename) + ".p2");

    evaluator1_.loadScriptString(sele1);
  }